

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_nt_test.c
# Opt level: O1

int dec_nt_decode(MpiDecTestCmd *cmd)

{
  MppCodingType MVar1;
  RK_U32 RVar2;
  RK_U32 RVar3;
  MPP_RET MVar4;
  MPP_RET MVar5;
  char *pcVar6;
  char *pcVar7;
  MppCtx ctx;
  MppDecCfg cfg;
  MppApi *mpi;
  MppFrame frame;
  MppPacket packet;
  pthread_t thd;
  MpiDecLoopData data;
  pthread_attr_t attr;
  
  ctx = (MppCtx)0x0;
  mpi = (MppApi *)0x0;
  packet = (MppPacket)0x0;
  frame = (MppFrame)0x0;
  MVar1 = cmd->type;
  RVar2 = cmd->width;
  RVar3 = cmd->height;
  cfg = (MppDecCfg)0x0;
  _mpp_log_l(4,"mpi_dec_nt_test","mpi_dec_test start\n",0);
  memset(&data,0,0xb8);
  pthread_attr_init((pthread_attr_t *)&attr);
  cmd->simple = (uint)(cmd->type != MPP_VIDEO_CodingMJPEG);
  if (cmd->have_output == 0) {
LAB_00105119:
    if (cmd->file_slt != (char *)0x0) {
      data.fp_verify = (FILE *)fopen(cmd->file_slt,"wt");
      if ((FILE *)data.fp_verify == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_dec_nt_test","failed to open verify file %s\n",0,cmd->file_slt);
      }
    }
    MVar4 = dec_buf_mgr_init(&data.buf_mgr);
    if (MVar4 == MPP_OK) {
      MVar4 = mpp_packet_init(&packet,0,0);
      _mpp_log_l(2,"mpi_dec_nt_test","mpp_packet_init get %p\n","dec_nt_decode",packet);
      if (MVar4 == MPP_OK) {
        MVar4 = mpp_create(&ctx,&mpi);
        if (MVar4 == MPP_OK) {
          _mpp_log_l(4,"mpi_dec_nt_test","%p mpi_dec_test decoder test start w %d h %d type %d\n",0,
                     ctx,RVar2,RVar3,MVar1);
          (*mpi->control)(ctx,MPP_SET_DISABLE_THREAD,(MppParam)0x0);
          MVar4 = mpp_init(ctx,0,MVar1);
          if (MVar4 == MPP_OK) {
            mpp_dec_cfg_init(&cfg);
            MVar4 = (*mpi->control)(ctx,MPP_DEC_GET_CFG,cfg);
            if (MVar4 == MPP_OK) {
              MVar4 = mpp_dec_cfg_set_u32(cfg,"base:split_parse",1);
              if (MVar4 == MPP_OK) {
                MVar4 = (*mpi->control)(ctx,MPP_DEC_SET_CFG,cfg);
                if (MVar4 == MPP_OK) {
                  data.ctx = ctx;
                  data.mpi = mpi;
                  data.loop_end = 0;
                  data.packet = packet;
                  data.frame = frame;
                  data.frame_count = 0;
                  data.frame_num = cmd->frame_num;
                  data.quiet = cmd->quiet;
                  data.cmd = cmd;
                  pthread_attr_setdetachstate((pthread_attr_t *)&attr,0);
                  MVar4 = pthread_create(&thd,(pthread_attr_t *)&attr,thread_decode,&data);
                  if (MVar4 == MPP_OK) {
                    if (cmd->frame_num < 0) {
                      _mpp_log_l(4,"mpi_dec_nt_test","*******************************************\n"
                                 ,0);
                      _mpp_log_l(4,"mpi_dec_nt_test","**** Press Enter to stop loop decoding ****\n"
                                 ,0);
                      _mpp_log_l(4,"mpi_dec_nt_test","*******************************************\n"
                                 ,0);
                      getc(_stdin);
                      data.loop_end = 1;
                    }
                    pthread_join(thd,(void **)0x0);
                    cmd->max_usage = data.max_usage;
                    MVar5 = (*mpi->reset)(ctx);
                    MVar4 = MPP_OK;
                    if (MVar5 != MPP_OK) {
                      _mpp_log_l(2,"mpi_dec_nt_test","%p mpi->reset failed\n",0,ctx);
                      MVar4 = MVar5;
                    }
                  }
                  else {
                    _mpp_log_l(2,"mpi_dec_nt_test","failed to create thread for input ret %d\n",0,
                               MVar4);
                  }
                }
                else {
                  _mpp_log_l(2,"mpi_dec_nt_test","%p failed to set cfg %p ret %d\n",0,ctx,cfg,MVar4)
                  ;
                }
                goto LAB_0010522d;
              }
              pcVar6 = "%p failed to set split_parse ret %d\n";
            }
            else {
              pcVar6 = "%p failed to get decoder cfg ret %d\n";
            }
            _mpp_log_l(2,"mpi_dec_nt_test",pcVar6,0,ctx,MVar4);
            goto LAB_0010522d;
          }
          pcVar7 = "%p mpp_init failed\n";
          pcVar6 = (char *)ctx;
          goto LAB_001051ee;
        }
        pcVar6 = "mpp_create failed\n";
      }
      else {
        pcVar6 = "mpp_packet_init failed\n";
      }
    }
    else {
      pcVar6 = "dec_buf_mgr_init failed\n";
    }
    _mpp_log_l(2,"mpi_dec_nt_test",pcVar6,0);
  }
  else {
    pcVar6 = cmd->file_output;
    data.fp_output = (FILE *)fopen(pcVar6,"w+b");
    if ((FILE *)data.fp_output != (FILE *)0x0) goto LAB_00105119;
    pcVar7 = "failed to open output file %s\n";
    MVar4 = MPP_OK;
LAB_001051ee:
    _mpp_log_l(2,"mpi_dec_nt_test",pcVar7,0,pcVar6);
  }
LAB_0010522d:
  if (data.packet != (MppPacket)0x0) {
    mpp_packet_deinit(&data.packet);
    data.packet = (MppPacket)0x0;
  }
  if (frame != (MppFrame)0x0) {
    mpp_frame_deinit(&frame);
    frame = (MppFrame)0x0;
  }
  if (ctx != (MppCtx)0x0) {
    mpp_destroy();
    ctx = (MppCtx)0x0;
  }
  data.frm_grp = (MppBufferGroup)0x0;
  if (data.buf_mgr != (DecBufMgr)0x0) {
    dec_buf_mgr_deinit(data.buf_mgr);
    data.buf_mgr = (DecBufMgr)0x0;
  }
  if (data.fp_output != (FILE *)0x0) {
    fclose((FILE *)data.fp_output);
    data.fp_output = (FILE *)0x0;
  }
  if (data.fp_verify != (FILE *)0x0) {
    fclose((FILE *)data.fp_verify);
    data.fp_verify = (FILE *)0x0;
  }
  if (cfg != (MppDecCfg)0x0) {
    mpp_dec_cfg_deinit();
    cfg = (MppDecCfg)0x0;
  }
  pthread_attr_destroy((pthread_attr_t *)&attr);
  return MVar4;
}

Assistant:

int dec_nt_decode(MpiDecTestCmd *cmd)
{
    // base flow context
    MppCtx ctx          = NULL;
    MppApi *mpi         = NULL;

    // input / output
    MppPacket packet    = NULL;
    MppFrame  frame     = NULL;

    // paramter for resource malloc
    RK_U32 width        = cmd->width;
    RK_U32 height       = cmd->height;
    MppCodingType type  = cmd->type;

    // config for runtime mode
    MppDecCfg cfg       = NULL;
    RK_U32 need_split   = 1;

    // resources
    MppBuffer frm_buf   = NULL;
    pthread_t thd;
    pthread_attr_t attr;
    MpiDecLoopData data;
    MPP_RET ret = MPP_OK;

    mpp_log("mpi_dec_test start\n");
    memset(&data, 0, sizeof(data));
    pthread_attr_init(&attr);

    cmd->simple = (cmd->type != MPP_VIDEO_CodingMJPEG) ? (1) : (0);

    if (cmd->have_output) {
        data.fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == data.fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            goto MPP_TEST_OUT;
        }
    }

    if (cmd->file_slt) {
        data.fp_verify = fopen(cmd->file_slt, "wt");
        if (!data.fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    ret = dec_buf_mgr_init(&data.buf_mgr);
    if (ret) {
        mpp_err("dec_buf_mgr_init failed\n");
        goto MPP_TEST_OUT;
    }

    ret = mpp_packet_init(&packet, NULL, 0);
    mpp_err_f("mpp_packet_init get %p\n", packet);
    if (ret) {
        mpp_err("mpp_packet_init failed\n");
        goto MPP_TEST_OUT;
    }

    // decoder demo
    ret = mpp_create(&ctx, &mpi);
    if (ret) {
        mpp_err("mpp_create failed\n");
        goto MPP_TEST_OUT;
    }

    mpp_log("%p mpi_dec_test decoder test start w %d h %d type %d\n",
            ctx, width, height, type);

    ret = mpi->control(ctx, MPP_SET_DISABLE_THREAD, NULL);

    ret = mpp_init(ctx, MPP_CTX_DEC, type);
    if (ret) {
        mpp_err("%p mpp_init failed\n", ctx);
        goto MPP_TEST_OUT;
    }

    mpp_dec_cfg_init(&cfg);

    /* get default config from decoder context */
    ret = mpi->control(ctx, MPP_DEC_GET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to get decoder cfg ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    /*
     * split_parse is to enable mpp internal frame spliter when the input
     * packet is not aplited into frames.
     */
    ret = mpp_dec_cfg_set_u32(cfg, "base:split_parse", need_split);
    if (ret) {
        mpp_err("%p failed to set split_parse ret %d\n", ctx, ret);
        goto MPP_TEST_OUT;
    }

    ret = mpi->control(ctx, MPP_DEC_SET_CFG, cfg);
    if (ret) {
        mpp_err("%p failed to set cfg %p ret %d\n", ctx, cfg, ret);
        goto MPP_TEST_OUT;
    }

    data.cmd            = cmd;
    data.ctx            = ctx;
    data.mpi            = mpi;
    data.loop_end       = 0;
    data.packet         = packet;
    data.frame          = frame;
    data.frame_count    = 0;
    data.frame_num      = cmd->frame_num;
    data.quiet          = cmd->quiet;

    pthread_attr_setdetachstate(&attr, PTHREAD_CREATE_JOINABLE);

    ret = pthread_create(&thd, &attr, thread_decode, &data);
    if (ret) {
        mpp_err("failed to create thread for input ret %d\n", ret);
        goto MPP_TEST_OUT;
    }

    if (cmd->frame_num < 0) {
        // wait for input then quit decoding
        mpp_log("*******************************************\n");
        mpp_log("**** Press Enter to stop loop decoding ****\n");
        mpp_log("*******************************************\n");

        getc(stdin);
        data.loop_end = 1;
    }

    pthread_join(thd, NULL);

    cmd->max_usage = data.max_usage;

    ret = mpi->reset(ctx);
    if (ret) {
        mpp_err("%p mpi->reset failed\n", ctx);
        goto MPP_TEST_OUT;
    }

MPP_TEST_OUT:
    if (data.packet) {
        mpp_packet_deinit(&data.packet);
        data.packet = NULL;
    }

    if (frame) {
        mpp_frame_deinit(&frame);
        frame = NULL;
    }

    if (ctx) {
        mpp_destroy(ctx);
        ctx = NULL;
    }

    if (!cmd->simple) {
        if (frm_buf) {
            mpp_buffer_put(frm_buf);
            frm_buf = NULL;
        }
    }

    data.frm_grp = NULL;
    if (data.buf_mgr) {
        dec_buf_mgr_deinit(data.buf_mgr);
        data.buf_mgr = NULL;
    }

    if (data.fp_output) {
        fclose(data.fp_output);
        data.fp_output = NULL;
    }

    if (data.fp_verify) {
        fclose(data.fp_verify);
        data.fp_verify = NULL;
    }

    if (cfg) {
        mpp_dec_cfg_deinit(cfg);
        cfg = NULL;
    }

    pthread_attr_destroy(&attr);

    return ret;
}